

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

RiceCompressionHeader lrit::getHeader<lrit::RiceCompressionHeader>(Buffer *b,int pos)

{
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_ESI;
  Buffer *in_RDI;
  HeaderReader<lrit::RiceCompressionHeader> r;
  RiceCompressionHeader h;
  HeaderReader<lrit::RiceCompressionHeader> *in_stack_ffffffffffffffc8;
  HeaderReader<lrit::RiceCompressionHeader> local_30;
  RiceCompressionHeader local_8;
  
  HeaderReader<lrit::RiceCompressionHeader>::HeaderReader(&local_30,in_RDI,in_ESI);
  local_8 = HeaderReader<lrit::RiceCompressionHeader>::getHeader(in_stack_ffffffffffffffc8);
  HeaderReader<lrit::RiceCompressionHeader>::read(&local_30,(int)&local_8 + 4,__buf,in_RCX);
  HeaderReader<lrit::RiceCompressionHeader>::read(&local_30,(int)&local_8 + 6,__buf_00,in_RCX);
  HeaderReader<lrit::RiceCompressionHeader>::read(&local_30,(int)&local_8 + 7,__buf_01,in_RCX);
  return local_8;
}

Assistant:

RiceCompressionHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<RiceCompressionHeader>(b, pos);
  auto h = r.getHeader();
  r.read(&h.flags);
  r.read(&h.pixelsPerBlock);
  r.read(&h.scanLinesPerPacket);
  return h;
}